

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::CreateBuffer::exec(CreateBuffer *this,Thread *t)

{
  ostream *poVar1;
  deUint32 err;
  Thread *pTVar2;
  GLuint buffer;
  GLuint local_1ac;
  undefined1 local_1a8 [136];
  ios_base local_120 [264];
  
  pTVar2 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar2 != (Thread *)0x0) {
    local_1ac = 0;
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1a8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 0x18),"Begin -- glGenBuffers(1, { 0 })",0x1f);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 8));
    std::ios_base::~ios_base(local_120);
    (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x6c8))(1,&local_1ac);
    err = (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"genBuffers(1, &buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4ab);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1a8 + 8));
    poVar1 = (ostream *)(local_1a8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"End -- glGenBuffers(1, { ",0x19);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," })",3);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 8));
    std::ios_base::~ios_base(local_120);
    ((this->m_buffer).m_ptr)->buffer = local_1ac;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void CreateBuffer::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint buffer = 0;

	thread.newMessage() << "Begin -- glGenBuffers(1, { 0 })" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, genBuffers(1, &buffer));
	thread.newMessage() << "End -- glGenBuffers(1, { " << buffer << " })" << tcu::ThreadUtil::Message::End;

	m_buffer->buffer = buffer;
}